

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O1

mat4 * mat4_from_quat(mat4 *__return_storage_ptr__,quat q)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = q.x;
  fVar2 = q.y;
  fVar3 = q.z;
  fVar7 = fVar3 * -2.0 * fVar3;
  fVar8 = fVar1 + fVar1;
  fVar5 = (fVar2 + fVar2) * fVar3;
  fVar6 = -(fVar2 + fVar2) * fVar2;
  fVar9 = q.w + q.w;
  fVar4 = 1.0 - fVar8 * fVar1;
  __return_storage_ptr__->m[0] = fVar6 + 1.0 + fVar7;
  __return_storage_ptr__->m[1] = fVar8 * fVar2 - fVar3 * fVar9;
  __return_storage_ptr__->m[2] = fVar8 * fVar3 + fVar2 * fVar9;
  __return_storage_ptr__->m[3] = 0.0;
  __return_storage_ptr__->m[4] = fVar8 * fVar2 + fVar3 * fVar9;
  __return_storage_ptr__->m[5] = fVar7 + fVar4;
  __return_storage_ptr__->m[6] = fVar5 - fVar9 * fVar1;
  __return_storage_ptr__->m[7] = 0.0;
  __return_storage_ptr__->m[8] = fVar8 * fVar3 - fVar2 * fVar9;
  __return_storage_ptr__->m[9] = fVar5 + fVar9 * fVar1;
  __return_storage_ptr__->m[10] = fVar4 + fVar6;
  __return_storage_ptr__->m[0xb] = 0.0;
  __return_storage_ptr__->m[0xc] = 0.0;
  __return_storage_ptr__->m[0xd] = 0.0;
  __return_storage_ptr__->m[0xe] = 0.0;
  __return_storage_ptr__->m[0xf] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_from_quat(quat q) {
    float x = q.x;
    float y = q.y;
    float z = q.z;
    float w = q.w;

    return mat4_create(
            1.0f - 2.0f * y * y - 2.0f * z * z, 2.0f * x * y - 2.0f * w * z, 2.0f * x * z + 2.0f * w * y,
            0.0f,
            2.0f * x * y + 2.0f * w * z, 1.0f - 2.0f * x * x - 2.0f * z * z, 2.0f * y * z - 2.0f * w * x,
            0.0f,
            2.0f * x * z - 2.0f * w * y, 2.0f * y * z + 2.0f * w * x, 1.0f - 2.0f * x * x - 2.0f * y * y,
            0.0f,
            0.0f, 0.0f, 0.0f, 1.0f);
}